

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBuildCommand.cxx
# Opt level: O3

bool cmBuildCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *args,cmExecutionStatus *status)

{
  string *psVar1;
  cmMakefile *pcVar2;
  pointer pbVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  cmValue cVar7;
  cmGlobalGenerator *pcVar8;
  int iVar9;
  string *psVar10;
  ulong uVar11;
  string_view value;
  string configType;
  string configuration;
  string target;
  string project_name;
  string makecommand;
  string parallel;
  undefined1 local_140 [48];
  string *local_110;
  string local_108;
  string local_e8;
  string local_c8;
  cmExecutionStatus *local_a8;
  undefined1 local_a0 [48];
  string local_70;
  string local_50;
  
  psVar10 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  uVar6 = (long)psVar1 - (long)psVar10;
  local_110 = psVar10;
  if (uVar6 == 0x40) {
    pcVar2 = status->Makefile;
    cVar7 = cmMakefile::GetDefinition(pcVar2,psVar10);
    local_140._0_8_ = local_140 + 0x10;
    local_140._8_8_ = (char *)0x0;
    local_140._16_8_ = local_140._16_8_ & 0xffffffffffffff00;
    bVar4 = cmsys::SystemTools::GetEnv("CMAKE_CONFIG_TYPE",(string *)local_140);
    if (!bVar4 || (char *)local_140._8_8_ == (char *)0x0) {
      std::__cxx11::string::_M_replace((ulong)local_140,0,(char *)local_140._8_8_,0x67d4d2);
    }
    pcVar8 = cmMakefile::GetGlobalGenerator(pcVar2);
    local_108._M_string_length = 0;
    local_108.field_2._M_local_buf[0] = '\0';
    local_c8._M_string_length = 0;
    local_c8.field_2._M_local_buf[0] = '\0';
    local_e8._M_string_length = 0;
    local_e8.field_2._M_local_buf[0] = '\0';
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    bVar4 = cmMakefile::IgnoreErrorsCMP0061(pcVar2);
    cmGlobalGenerator::GenerateCMakeBuildCommand
              ((string *)local_a0,pcVar8,&local_108,(string *)local_140,&local_c8,&local_e8,bVar4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,
                      CONCAT71(local_e8.field_2._M_allocated_capacity._1_7_,
                               local_e8.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,
                      CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                               local_c8.field_2._M_local_buf[0]) + 1);
    }
    psVar10 = local_110;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                               local_108.field_2._M_local_buf[0]) + 1);
    }
    if (cVar7.Value == (string *)0x0) {
      cmMakefile::AddCacheDefinition
                (pcVar2,psVar10,(char *)local_a0._0_8_,
                 "Command used to build entire project from the command line.",STRING,false);
    }
    if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
      operator_delete((void *)local_a0._0_8_,CONCAT71(local_a0._17_7_,local_a0[0x10]) + 1);
    }
    if ((undefined1 *)local_140._0_8_ != local_140 + 0x10) {
      operator_delete((void *)local_140._0_8_,local_140._16_8_ + 1);
    }
    return true;
  }
  if (psVar10 == psVar1) {
    local_a0._0_8_ = &DAT_00000036;
    local_140._0_8_ = local_140 + 0x10;
    local_140._0_8_ = std::__cxx11::string::_M_create((ulong *)local_140,(ulong)local_a0);
    local_140._16_8_ = local_a0._0_8_;
    builtin_strncpy((char *)local_140._0_8_,"requires at least one argument naming a CMake variable"
                    ,0x36);
    local_140._8_8_ = local_a0._0_8_;
    *(char *)(local_140._0_8_ + local_a0._0_8_) = '\0';
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((undefined1 *)local_140._0_8_ != local_140 + 0x10) {
      operator_delete((void *)local_140._0_8_,(ulong)(local_140._16_8_ + 1));
    }
    return false;
  }
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  iVar9 = 0;
  local_108._M_string_length = 0;
  local_108.field_2._M_local_buf[0] = '\0';
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_local_buf[0] = '\0';
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  local_e8._M_string_length = 0;
  local_e8.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  if (0x20 < uVar6) {
    uVar6 = 1;
    uVar11 = 2;
    local_a8 = status;
    do {
      iVar5 = std::__cxx11::string::compare((char *)(psVar10 + uVar6));
      if (iVar5 == 0) {
        iVar9 = 1;
      }
      else {
        iVar5 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar6));
        if (iVar5 == 0) {
          iVar9 = 2;
        }
        else {
          iVar5 = std::__cxx11::string::compare
                            ((char *)((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar6));
          if (iVar5 == 0) {
            iVar9 = 3;
          }
          else {
            iVar5 = std::__cxx11::string::compare
                              ((char *)((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + uVar6));
            if (iVar5 == 0) {
              iVar9 = 4;
            }
            else {
              if (3 < iVar9 - 1U) {
                local_140._0_8_ = (char *)0x12;
                local_140._8_8_ = "unknown argument \"";
                pbVar3 = (args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                local_a0._8_8_ = pbVar3[uVar6]._M_dataplus._M_p;
                local_a0._0_8_ = pbVar3[uVar6]._M_string_length;
                cmStrCat<char[2]>(&local_50,(cmAlphaNum *)local_140,(cmAlphaNum *)local_a0,
                                  (char (*) [2])0x6a6eb3);
                std::__cxx11::string::_M_assign((string *)&local_a8->Error);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_50._M_dataplus._M_p != &local_50.field_2) {
                  operator_delete(local_50._M_dataplus._M_p,
                                  local_50.field_2._M_allocated_capacity + 1);
                }
                bVar4 = false;
                goto LAB_001a9afe;
              }
              psVar10 = &local_108;
              switch(iVar9) {
              case 2:
                psVar10 = &local_c8;
                break;
              case 3:
                psVar10 = &local_e8;
                break;
              case 4:
                psVar10 = &local_70;
              }
              iVar9 = 0;
              std::__cxx11::string::_M_assign((string *)psVar10);
            }
          }
        }
      }
      psVar10 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      bVar4 = uVar11 < (ulong)((long)(args->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)psVar10 >>
                              5);
      uVar6 = uVar11;
      uVar11 = (ulong)((int)uVar11 + 1);
    } while (bVar4);
    status = local_a8;
    if (local_108._M_string_length != 0) goto LAB_001a99b5;
  }
  cmsys::SystemTools::GetEnv("CMAKE_CONFIG_TYPE",&local_108);
  if (local_108._M_string_length == 0) {
    std::__cxx11::string::_M_replace((ulong)&local_108,0,(char *)0x0,0x67d4d2);
  }
LAB_001a99b5:
  pcVar2 = status->Makefile;
  if (local_c8._M_string_length != 0) {
    local_a0._0_8_ = &DAT_00000036;
    local_140._0_8_ = local_140 + 0x10;
    local_140._0_8_ = std::__cxx11::string::_M_create((ulong *)local_140,(ulong)local_a0);
    local_140._16_8_ = local_a0._0_8_;
    builtin_strncpy((char *)local_140._0_8_,"Ignoring PROJECT_NAME option because it has no effect."
                    ,0x36);
    local_140._8_8_ = local_a0._0_8_;
    *(char *)(local_140._0_8_ + local_a0._0_8_) = '\0';
    cmMakefile::IssueMessage(pcVar2,AUTHOR_WARNING,(string *)local_140);
    if ((undefined1 *)local_140._0_8_ != local_140 + 0x10) {
      operator_delete((void *)local_140._0_8_,(ulong)(local_140._16_8_ + 1));
    }
  }
  pcVar8 = cmMakefile::GetGlobalGenerator(pcVar2);
  local_a0._8_8_ = (pointer)0x0;
  local_a0[0x10] = '\0';
  local_a0._0_8_ = local_a0 + 0x10;
  bVar4 = cmMakefile::IgnoreErrorsCMP0061(pcVar2);
  cmGlobalGenerator::GenerateCMakeBuildCommand
            ((string *)local_140,pcVar8,&local_e8,&local_108,&local_70,(string *)local_a0,bVar4);
  if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
    operator_delete((void *)local_a0._0_8_,CONCAT71(local_a0._17_7_,local_a0[0x10]) + 1);
  }
  value._M_str = (char *)local_140._0_8_;
  value._M_len = local_140._8_8_;
  cmMakefile::AddDefinition(pcVar2,local_110,value);
  if ((undefined1 *)local_140._0_8_ != local_140 + 0x10) {
    operator_delete((void *)local_140._0_8_,(ulong)(local_140._16_8_ + 1));
  }
  bVar4 = true;
LAB_001a9afe:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,
                    CONCAT71(local_e8.field_2._M_allocated_capacity._1_7_,
                             local_e8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,
                    CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                             local_c8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,
                    CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                             local_108.field_2._M_local_buf[0]) + 1);
  }
  return bVar4;
}

Assistant:

bool cmBuildCommand(std::vector<std::string> const& args,
                    cmExecutionStatus& status)
{
  // Support the legacy signature of the command:
  if (args.size() == 2) {
    return TwoArgsSignature(args, status);
  }

  return MainSignature(args, status);
}